

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

char * __thiscall Analyzer::getFunctionName(Analyzer *this,Node *node)

{
  char *pcVar1;
  Node *pNVar2;
  NodeType NVar3;
  
  pcVar1 = "";
  if ((node->nodeType - PNT_FUNCTION_CALL < 2) &&
     (pNVar2 = *(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start, pNVar2 != (Node *)0x0)) {
    NVar3 = pNVar2->nodeType;
    if (NVar3 - PNT_ACCESS_MEMBER < 2) {
      pNVar2 = *(Node **)(*(long *)&(pNVar2->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data + 8);
      NVar3 = pNVar2->nodeType;
    }
    if (NVar3 == PNT_IDENTIFIER) {
      pcVar1 = (char *)(pNVar2->tok->u).d;
    }
  }
  return pcVar1;
}

Assistant:

const char * getFunctionName(Node * node)
  {
    if (node->nodeType == PNT_FUNCTION_CALL || node->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      Node * functionNameNode = node->children[0];

      if (functionNameNode)
      {
        if (functionNameNode->nodeType == PNT_ACCESS_MEMBER || functionNameNode->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
          functionNameNode = functionNameNode->children[1];

        if (functionNameNode->nodeType == PNT_IDENTIFIER)
        {
          const char * functionName = functionNameNode->tok.u.s;
          return functionName;
        }
      }
    }

    return "";
  }